

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fInstancedRenderingTests.cpp
# Opt level: O3

int __thiscall
deqp::gles3::Functional::InstancedRenderingCase::init
          (InstancedRenderingCase *this,EVP_PKEY_CTX *ctx)

{
  vector<float,_std::allocator<float>_> *this_00;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *this_01;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  DataType dataType;
  RenderContext *renderCtx;
  bool bVar2;
  unsigned_short uVar3;
  int iVar4;
  InstancingType IVar5;
  undefined4 extraout_var;
  long *plVar6;
  undefined8 *puVar7;
  ShaderProgram *this_02;
  unsigned_short *puVar8;
  float *pfVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  TestError *this_03;
  size_type *psVar11;
  long *plVar12;
  int precision;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  long extraout_RDX;
  size_type extraout_RDX_00;
  size_type extraout_RDX_01;
  size_type sVar13;
  bool bVar14;
  unsigned_short uVar15;
  int y;
  uint uVar16;
  char *pcVar17;
  undefined8 uVar18;
  iterator iVar19;
  iterator iVar20;
  _Alloc_hider _Var21;
  unsigned_short uVar22;
  int iVar23;
  uint uVar24;
  pointer pcVar25;
  ulong uVar26;
  int x;
  int iVar27;
  int iVar28;
  long lVar29;
  unsigned_short uVar30;
  uint uVar31;
  float fVar32;
  float fVar33;
  string vertShaderSourceStr;
  float fy;
  float fy0;
  float fy1;
  string floatUintBiasStr;
  string floatUintScaleStr;
  string floatIntBiasStr;
  string instanceAttribs;
  string numInstancesStr;
  string swizzleFirst;
  string floatIntScaleStr;
  ProgramSources sources;
  string colorBExpression;
  string colorGExpression;
  string colorRExpression;
  string posExpression;
  string typeName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_460;
  value_type local_440;
  long *local_420;
  long local_418;
  long local_410;
  long lStack_408;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_400;
  float local_3dc;
  ulong local_3d8;
  string local_3d0;
  string local_3b0;
  string local_390;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_370;
  string local_350;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_330;
  long *local_310;
  long local_308;
  long local_300;
  long lStack_2f8;
  int local_2ec;
  undefined1 local_2e8 [24];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  avStack_2d0 [3];
  ios_base local_278 [32];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_258;
  undefined1 local_238 [200];
  undefined1 *local_170;
  char *local_168;
  undefined1 local_160;
  undefined7 uStack_15f;
  undefined1 *local_150;
  char *local_148;
  undefined1 local_140;
  undefined7 uStack_13f;
  undefined1 *local_130;
  undefined8 local_128;
  undefined1 local_120;
  undefined7 uStack_11f;
  undefined1 *local_110;
  char *local_108;
  undefined1 local_100;
  undefined7 uStack_ff;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  long *local_d0;
  long local_c8;
  long local_c0;
  long lStack_b8;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  dataType = this->m_rgbAttrType;
  iVar4 = glu::getDataTypeScalarSize(dataType);
  local_3d8 = CONCAT44(extraout_var,iVar4);
  pcVar17 = ".x";
  if (iVar4 == 1) {
    pcVar17 = "";
  }
  local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_330,pcVar17,pcVar17 + (ulong)(iVar4 != 1) * 2);
  pcVar17 = glu::getDataTypeName(this->m_rgbAttrType);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,pcVar17,(allocator<char> *)local_2e8);
  de::floatToString_abi_cxx11_(&local_390,(de *)0x3,100.0,precision);
  plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_390,0,(char *)0x0,0x1b54568);
  pcVar25 = local_2e8 + 0x10;
  psVar11 = (size_type *)(plVar6 + 2);
  if ((size_type *)*plVar6 == psVar11) {
    local_2e8._16_8_ = *psVar11;
    avStack_2d0[0].
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)plVar6[3];
    local_2e8._0_8_ = pcVar25;
  }
  else {
    local_2e8._16_8_ = *psVar11;
    local_2e8._0_8_ = (size_type *)*plVar6;
  }
  local_2e8._8_8_ = plVar6[1];
  *plVar6 = (long)psVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append(local_2e8);
  local_310 = &local_300;
  plVar12 = plVar6 + 2;
  if ((long *)*plVar6 == plVar12) {
    local_300 = *plVar12;
    lStack_2f8 = plVar6[3];
  }
  else {
    local_300 = *plVar12;
    local_310 = (long *)*plVar6;
  }
  lVar29 = plVar6[1];
  *plVar6 = (long)plVar12;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_308 = lVar29;
  if ((pointer)local_2e8._0_8_ != pcVar25) {
    operator_delete((void *)local_2e8._0_8_,local_2e8._16_8_ + 1);
    lVar29 = extraout_RDX;
  }
  iVar4 = (int)lVar29;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390._M_dataplus._M_p != &local_390.field_2) {
    operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
    iVar4 = extraout_EDX;
  }
  de::floatToString_abi_cxx11_(&local_3b0,(de *)0x3,-50.0,iVar4);
  plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_3b0,0,(char *)0x0,0x1b54568);
  psVar11 = (size_type *)(plVar6 + 2);
  if ((size_type *)*plVar6 == psVar11) {
    local_2e8._16_8_ = *psVar11;
    avStack_2d0[0].
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)plVar6[3];
    local_2e8._0_8_ = pcVar25;
  }
  else {
    local_2e8._16_8_ = *psVar11;
    local_2e8._0_8_ = (size_type *)*plVar6;
  }
  local_2e8._8_8_ = plVar6[1];
  *plVar6 = (long)psVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append(local_2e8);
  local_390._M_dataplus._M_p = (pointer)&local_390.field_2;
  psVar11 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    local_390.field_2._M_allocated_capacity = *psVar11;
    local_390.field_2._8_8_ = plVar6[3];
  }
  else {
    local_390.field_2._M_allocated_capacity = *psVar11;
    local_390._M_dataplus._M_p = (pointer)*plVar6;
  }
  sVar13 = plVar6[1];
  *plVar6 = (long)psVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_390._M_string_length = sVar13;
  if ((pointer)local_2e8._0_8_ != pcVar25) {
    operator_delete((void *)local_2e8._0_8_,local_2e8._16_8_ + 1);
    sVar13 = extraout_RDX_00;
  }
  iVar4 = (int)sVar13;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
    operator_delete(local_3b0._M_dataplus._M_p,local_3b0.field_2._M_allocated_capacity + 1);
    iVar4 = extraout_EDX_00;
  }
  de::floatToString_abi_cxx11_(&local_3d0,(de *)0x3,100.0,iVar4);
  plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_3d0,0,(char *)0x0,0x1b54568);
  psVar11 = (size_type *)(plVar6 + 2);
  if ((size_type *)*plVar6 == psVar11) {
    local_2e8._16_8_ = *psVar11;
    avStack_2d0[0].
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)plVar6[3];
    local_2e8._0_8_ = pcVar25;
  }
  else {
    local_2e8._16_8_ = *psVar11;
    local_2e8._0_8_ = (size_type *)*plVar6;
  }
  local_2e8._8_8_ = plVar6[1];
  *plVar6 = (long)psVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append(local_2e8);
  local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
  psVar11 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    local_3b0.field_2._M_allocated_capacity = *psVar11;
    local_3b0.field_2._8_8_ = plVar6[3];
  }
  else {
    local_3b0.field_2._M_allocated_capacity = *psVar11;
    local_3b0._M_dataplus._M_p = (pointer)*plVar6;
  }
  sVar13 = plVar6[1];
  *plVar6 = (long)psVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_3b0._M_string_length = sVar13;
  if ((pointer)local_2e8._0_8_ != pcVar25) {
    operator_delete((void *)local_2e8._0_8_,local_2e8._16_8_ + 1);
    sVar13 = extraout_RDX_01;
  }
  iVar4 = (int)sVar13;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
    operator_delete(local_3d0._M_dataplus._M_p,local_3d0.field_2._M_allocated_capacity + 1);
    iVar4 = extraout_EDX_01;
  }
  de::floatToString_abi_cxx11_(&local_350,(de *)0x3,0.0,iVar4);
  plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_350,0,(char *)0x0,0x1b54568);
  psVar11 = (size_type *)(plVar6 + 2);
  if ((size_type *)*plVar6 == psVar11) {
    local_2e8._16_8_ = *psVar11;
    avStack_2d0[0].
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)plVar6[3];
    local_2e8._0_8_ = pcVar25;
  }
  else {
    local_2e8._16_8_ = *psVar11;
    local_2e8._0_8_ = (size_type *)*plVar6;
  }
  local_2e8._8_8_ = plVar6[1];
  *plVar6 = (long)psVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append(local_2e8);
  local_3d0._M_dataplus._M_p = (pointer)&local_3d0.field_2;
  psVar11 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    local_3d0.field_2._M_allocated_capacity = *psVar11;
    local_3d0.field_2._8_8_ = plVar6[3];
  }
  else {
    local_3d0.field_2._M_allocated_capacity = *psVar11;
    local_3d0._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_3d0._M_string_length = plVar6[1];
  *plVar6 = (long)psVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  if ((pointer)local_2e8._0_8_ != pcVar25) {
    operator_delete((void *)local_2e8._0_8_,local_2e8._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_350._M_dataplus._M_p != &local_350.field_2) {
    operator_delete(local_350._M_dataplus._M_p,local_350.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2e8);
  std::ostream::operator<<(local_2e8,this->m_numInstances);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2e8);
  std::ios_base::~ios_base(local_278);
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_370);
  local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
  psVar11 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    local_350.field_2._M_allocated_capacity = *psVar11;
    local_350.field_2._8_8_ = plVar6[3];
  }
  else {
    local_350.field_2._M_allocated_capacity = *psVar11;
    local_350._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_350._M_string_length = plVar6[1];
  *plVar6 = (long)psVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_370._M_dataplus._M_p != &local_370.field_2) {
    operator_delete(local_370._M_dataplus._M_p,
                    CONCAT71(local_370.field_2._M_allocated_capacity._1_7_,
                             local_370.field_2._M_local_buf[0]) + 1);
  }
  local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
  local_370._M_string_length = 0;
  local_370.field_2._M_local_buf[0] = '\0';
  local_110 = &local_100;
  local_108 = (char *)0x0;
  local_100 = 0;
  local_130 = &local_120;
  local_128 = 0;
  local_120 = 0;
  local_150 = &local_140;
  local_148 = (char *)0x0;
  local_140 = 0;
  local_170 = &local_160;
  local_168 = (char *)0x0;
  local_160 = 0;
  IVar5 = this->m_instancingType;
  if ((IVar5 & ~TYPE_MIXED) == TYPE_INSTANCE_ID) {
    std::operator+(&local_460,"a_position + vec4(float(gl_InstanceID) * 2.0 / ",&local_350);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_460);
    psVar11 = (size_type *)(plVar6 + 2);
    if ((size_type *)*plVar6 == psVar11) {
      local_2e8._16_8_ = *psVar11;
      avStack_2d0[0].
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)plVar6[3];
      local_2e8._0_8_ = pcVar25;
    }
    else {
      local_2e8._16_8_ = *psVar11;
      local_2e8._0_8_ = (size_type *)*plVar6;
    }
    local_2e8._8_8_ = plVar6[1];
    *plVar6 = (long)psVar11;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_110,(string *)local_2e8);
    if ((pointer)local_2e8._0_8_ != pcVar25) {
      operator_delete((void *)local_2e8._0_8_,local_2e8._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_460._M_dataplus._M_p != &local_460.field_2) {
      operator_delete(local_460._M_dataplus._M_p,local_460.field_2._M_allocated_capacity + 1);
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e8,
                   "float(gl_InstanceID)/",&local_350);
    std::__cxx11::string::operator=((string *)&local_130,(string *)local_2e8);
    if ((pointer)local_2e8._0_8_ != pcVar25) {
      operator_delete((void *)local_2e8._0_8_,local_2e8._16_8_ + 1);
    }
    IVar5 = this->m_instancingType;
    if (IVar5 == TYPE_INSTANCE_ID) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e8,
                     "float(gl_InstanceID)*2.0/",&local_350);
      std::__cxx11::string::operator=((string *)&local_150,(string *)local_2e8);
      if ((pointer)local_2e8._0_8_ != pcVar25) {
        operator_delete((void *)local_2e8._0_8_,local_2e8._16_8_ + 1);
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e8,
                     "1.0 - float(gl_InstanceID)/",&local_350);
      std::__cxx11::string::operator=((string *)&local_170,(string *)local_2e8);
      if ((pointer)local_2e8._0_8_ != pcVar25) {
        operator_delete((void *)local_2e8._0_8_,local_2e8._16_8_ + 1);
      }
      IVar5 = this->m_instancingType;
    }
  }
  if (1 < IVar5 - TYPE_ATTRIB_DIVISOR) goto LAB_0119a51e;
  local_3dc = (float)CONCAT31(local_3dc._1_3_,
                              dataType - TYPE_FLOAT_MAT2 < 9 || dataType - TYPE_DOUBLE_MAT2 < 9);
  if (IVar5 == TYPE_ATTRIB_DIVISOR) {
    std::__cxx11::string::_M_replace((ulong)&local_110,0,local_108,0x1c00c66);
    std::__cxx11::string::append((char *)&local_110);
    std::__cxx11::string::append((char *)&local_110);
    if (dataType - TYPE_FLOAT < 4) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e8,
                     "a_instanceR",&local_330);
      std::__cxx11::string::operator=((string *)&local_130,(string *)local_2e8);
      uVar18 = local_2e8._16_8_;
      _Var21._M_p = (pointer)local_2e8._0_8_;
      if ((pointer)local_2e8._0_8_ != pcVar25) {
LAB_01199836:
        operator_delete(_Var21._M_p,uVar18 + 1);
      }
    }
    else {
      if (dataType - TYPE_INT < 4) {
        std::operator+(&local_400,"(float(a_instanceR",&local_330);
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_400);
        local_420 = &local_410;
        plVar12 = plVar6 + 2;
        if ((long *)*plVar6 == plVar12) {
          local_410 = *plVar12;
          lStack_408 = plVar6[3];
        }
        else {
          local_410 = *plVar12;
          local_420 = (long *)*plVar6;
        }
        local_418 = plVar6[1];
        *plVar6 = (long)plVar12;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        plVar6 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_420,(ulong)local_390._M_dataplus._M_p);
        local_440._M_dataplus._M_p = (pointer)&local_440.field_2;
        psVar11 = (size_type *)(plVar6 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_440.field_2._M_allocated_capacity = *psVar11;
          local_440.field_2._8_8_ = plVar6[3];
        }
        else {
          local_440.field_2._M_allocated_capacity = *psVar11;
          local_440._M_dataplus._M_p = (pointer)*plVar6;
        }
        local_440._M_string_length = plVar6[1];
        *plVar6 = (long)psVar11;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_440);
        psVar11 = (size_type *)(plVar6 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_460.field_2._M_allocated_capacity = *psVar11;
          local_460.field_2._8_8_ = plVar6[3];
          local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
        }
        else {
          local_460.field_2._M_allocated_capacity = *psVar11;
          local_460._M_dataplus._M_p = (pointer)*plVar6;
        }
        local_460._M_string_length = plVar6[1];
        *plVar6 = (long)psVar11;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        plVar6 = (long *)std::__cxx11::string::_M_append((char *)&local_460,(ulong)local_310);
        psVar11 = (size_type *)(plVar6 + 2);
        if ((size_type *)*plVar6 == psVar11) {
          local_2e8._16_8_ = *psVar11;
          avStack_2d0[0].
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)plVar6[3];
          local_2e8._0_8_ = local_2e8 + 0x10;
        }
        else {
          local_2e8._16_8_ = *psVar11;
          local_2e8._0_8_ = (size_type *)*plVar6;
        }
        local_2e8._8_8_ = plVar6[1];
        *plVar6 = (long)psVar11;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        std::__cxx11::string::operator=((string *)&local_130,(string *)local_2e8);
        if ((undefined1 *)local_2e8._0_8_ != local_2e8 + 0x10) {
          operator_delete((void *)local_2e8._0_8_,local_2e8._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_460._M_dataplus._M_p != &local_460.field_2) {
          operator_delete(local_460._M_dataplus._M_p,local_460.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_440._M_dataplus._M_p != &local_440.field_2) {
          operator_delete(local_440._M_dataplus._M_p,local_440.field_2._M_allocated_capacity + 1);
        }
        if (local_420 != &local_410) {
LAB_01199816:
          operator_delete(local_420,local_410 + 1);
        }
      }
      else {
        if (3 < dataType - TYPE_UINT) {
          if (local_3dc._0_1_ != '\0') {
            std::__cxx11::string::operator=((string *)&local_130,"a_instanceR[0][0]");
          }
          goto LAB_0119983e;
        }
        std::operator+(&local_400,"(float(a_instanceR",&local_330);
        puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_400);
        plVar6 = puVar7 + 2;
        if ((long *)*puVar7 == plVar6) {
          local_410 = *plVar6;
          lStack_408 = puVar7[3];
          local_420 = &local_410;
        }
        else {
          local_410 = *plVar6;
          local_420 = (long *)*puVar7;
        }
        local_418 = puVar7[1];
        *puVar7 = plVar6;
        puVar7[1] = 0;
        *(undefined1 *)(puVar7 + 2) = 0;
        puVar7 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_420,(ulong)local_3d0._M_dataplus._M_p);
        local_440._M_dataplus._M_p = (pointer)&local_440.field_2;
        psVar11 = puVar7 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_440.field_2._M_allocated_capacity = *psVar11;
          local_440.field_2._8_8_ = puVar7[3];
        }
        else {
          local_440.field_2._M_allocated_capacity = *psVar11;
          local_440._M_dataplus._M_p = (pointer)*puVar7;
        }
        local_440._M_string_length = puVar7[1];
        *puVar7 = psVar11;
        puVar7[1] = 0;
        *(undefined1 *)(puVar7 + 2) = 0;
        puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_440);
        local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
        psVar11 = puVar7 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_460.field_2._M_allocated_capacity = *psVar11;
          local_460.field_2._8_8_ = puVar7[3];
        }
        else {
          local_460.field_2._M_allocated_capacity = *psVar11;
          local_460._M_dataplus._M_p = (pointer)*puVar7;
        }
        local_460._M_string_length = puVar7[1];
        *puVar7 = psVar11;
        puVar7[1] = 0;
        *(undefined1 *)(puVar7 + 2) = 0;
        plVar6 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_460,(ulong)local_3b0._M_dataplus._M_p);
        psVar11 = (size_type *)(plVar6 + 2);
        if ((size_type *)*plVar6 == psVar11) {
          local_2e8._16_8_ = *psVar11;
          avStack_2d0[0].
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)plVar6[3];
          local_2e8._0_8_ = local_2e8 + 0x10;
        }
        else {
          local_2e8._16_8_ = *psVar11;
          local_2e8._0_8_ = (size_type *)*plVar6;
        }
        local_2e8._8_8_ = plVar6[1];
        *plVar6 = (long)psVar11;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        std::__cxx11::string::operator=((string *)&local_130,(string *)local_2e8);
        if ((undefined1 *)local_2e8._0_8_ != local_2e8 + 0x10) {
          operator_delete((void *)local_2e8._0_8_,local_2e8._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_460._M_dataplus._M_p != &local_460.field_2) {
          operator_delete(local_460._M_dataplus._M_p,local_460.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_440._M_dataplus._M_p != &local_440.field_2) {
          operator_delete(local_440._M_dataplus._M_p,local_440.field_2._M_allocated_capacity + 1);
        }
        if (local_420 != &local_410) goto LAB_01199816;
      }
      uVar18 = local_400.field_2._M_allocated_capacity;
      _Var21._M_p = local_400._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_400._M_dataplus._M_p != &local_400.field_2) goto LAB_01199836;
    }
LAB_0119983e:
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2e8);
    std::ostream::operator<<(local_2e8,3);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2e8);
    std::ios_base::~ios_base(local_278);
    puVar7 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_400,0,(char *)0x0,0x1bc617d);
    plVar6 = puVar7 + 2;
    if ((long *)*puVar7 == plVar6) {
      local_410 = *plVar6;
      lStack_408 = puVar7[3];
      local_420 = &local_410;
    }
    else {
      local_410 = *plVar6;
      local_420 = (long *)*puVar7;
    }
    local_418 = puVar7[1];
    *puVar7 = plVar6;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_420,0,(char *)0x0,0x1c89380);
    psVar11 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar11) {
      local_440.field_2._M_allocated_capacity = *psVar11;
      local_440.field_2._8_8_ = plVar6[3];
      local_440._M_dataplus._M_p = (pointer)&local_440.field_2;
    }
    else {
      local_440.field_2._M_allocated_capacity = *psVar11;
      local_440._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_440._M_string_length = plVar6[1];
    *plVar6 = (long)psVar11;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_440);
    paVar10 = &local_460.field_2;
    psVar11 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar11) {
      local_460.field_2._M_allocated_capacity = *psVar11;
      local_460.field_2._8_8_ = plVar6[3];
      local_460._M_dataplus._M_p = (pointer)paVar10;
    }
    else {
      local_460.field_2._M_allocated_capacity = *psVar11;
      local_460._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_460._M_string_length = plVar6[1];
    *plVar6 = (long)psVar11;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&local_370,(ulong)local_460._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_460._M_dataplus._M_p != paVar10) {
      operator_delete(local_460._M_dataplus._M_p,local_460.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_440._M_dataplus._M_p != &local_440.field_2) {
      operator_delete(local_440._M_dataplus._M_p,local_440.field_2._M_allocated_capacity + 1);
    }
    if (local_420 != &local_410) {
      operator_delete(local_420,local_410 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_400._M_dataplus._M_p != &local_400.field_2) {
      operator_delete(local_400._M_dataplus._M_p,local_400.field_2._M_allocated_capacity + 1);
    }
    std::operator+(&local_460,"in mediump ",&local_70);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_460);
    psVar11 = (size_type *)(plVar6 + 2);
    if ((size_type *)*plVar6 == psVar11) {
      local_2e8._16_8_ = *psVar11;
      avStack_2d0[0].
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)plVar6[3];
      local_2e8._0_8_ = local_2e8 + 0x10;
    }
    else {
      local_2e8._16_8_ = *psVar11;
      local_2e8._0_8_ = (size_type *)*plVar6;
    }
    local_2e8._8_8_ = plVar6[1];
    *plVar6 = (long)psVar11;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&local_370,local_2e8._0_8_);
    if ((undefined1 *)local_2e8._0_8_ != local_2e8 + 0x10) {
      operator_delete((void *)local_2e8._0_8_,local_2e8._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_460._M_dataplus._M_p != paVar10) {
      operator_delete(local_460._M_dataplus._M_p,local_460.field_2._M_allocated_capacity + 1);
    }
  }
  pcVar25 = local_2e8 + 0x10;
  if (dataType - TYPE_FLOAT < 4) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e8,
                   "a_instanceG",&local_330);
    std::__cxx11::string::operator=((string *)&local_150,(string *)local_2e8);
    if ((pointer)local_2e8._0_8_ != pcVar25) {
      operator_delete((void *)local_2e8._0_8_,local_2e8._16_8_ + 1);
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e8,
                   "a_instanceB",&local_330);
    std::__cxx11::string::operator=((string *)&local_170,(string *)local_2e8);
    local_400.field_2._M_allocated_capacity = local_2e8._16_8_;
    local_400._M_dataplus._M_p = (pointer)local_2e8._0_8_;
    if ((pointer)local_2e8._0_8_ != pcVar25) {
LAB_0119a37e:
      operator_delete(local_400._M_dataplus._M_p,local_400.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    if (dataType - TYPE_INT < 4) {
      std::operator+(&local_400,"(float(a_instanceG",&local_330);
      puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_400);
      local_420 = &local_410;
      plVar6 = puVar7 + 2;
      if ((long *)*puVar7 == plVar6) {
        local_410 = *plVar6;
        lStack_408 = puVar7[3];
      }
      else {
        local_410 = *plVar6;
        local_420 = (long *)*puVar7;
      }
      local_418 = puVar7[1];
      *puVar7 = plVar6;
      puVar7[1] = 0;
      *(undefined1 *)(puVar7 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_420,(ulong)local_390._M_dataplus._M_p);
      paVar10 = &local_440.field_2;
      psVar11 = (size_type *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar11) {
        local_440.field_2._M_allocated_capacity = *psVar11;
        local_440.field_2._8_8_ = plVar6[3];
        local_440._M_dataplus._M_p = (pointer)paVar10;
      }
      else {
        local_440.field_2._M_allocated_capacity = *psVar11;
        local_440._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_440._M_string_length = plVar6[1];
      *plVar6 = (long)psVar11;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_440);
      paVar1 = &local_460.field_2;
      psVar11 = (size_type *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar11) {
        local_460.field_2._M_allocated_capacity = *psVar11;
        local_460.field_2._8_8_ = plVar6[3];
        local_460._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_460.field_2._M_allocated_capacity = *psVar11;
        local_460._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_460._M_string_length = plVar6[1];
      *plVar6 = (long)psVar11;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::_M_append((char *)&local_460,(ulong)local_310);
      psVar11 = (size_type *)(plVar6 + 2);
      if ((size_type *)*plVar6 == psVar11) {
        local_2e8._16_8_ = *psVar11;
        avStack_2d0[0].
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)plVar6[3];
        local_2e8._0_8_ = pcVar25;
      }
      else {
        local_2e8._16_8_ = *psVar11;
        local_2e8._0_8_ = (size_type *)*plVar6;
      }
      local_2e8._8_8_ = plVar6[1];
      *plVar6 = (long)psVar11;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      std::__cxx11::string::operator=((string *)&local_150,(string *)local_2e8);
      if ((pointer)local_2e8._0_8_ != pcVar25) {
        operator_delete((void *)local_2e8._0_8_,local_2e8._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_460._M_dataplus._M_p != paVar1) {
        operator_delete(local_460._M_dataplus._M_p,local_460.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_440._M_dataplus._M_p != paVar10) {
        operator_delete(local_440._M_dataplus._M_p,local_440.field_2._M_allocated_capacity + 1);
      }
      if (local_420 != &local_410) {
        operator_delete(local_420,local_410 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_400._M_dataplus._M_p != &local_400.field_2) {
        operator_delete(local_400._M_dataplus._M_p,local_400.field_2._M_allocated_capacity + 1);
      }
      std::operator+(&local_400,"(float(a_instanceB",&local_330);
      puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_400);
      plVar6 = puVar7 + 2;
      if ((long *)*puVar7 == plVar6) {
        local_410 = *plVar6;
        lStack_408 = puVar7[3];
        local_420 = &local_410;
      }
      else {
        local_410 = *plVar6;
        local_420 = (long *)*puVar7;
      }
      local_418 = puVar7[1];
      *puVar7 = plVar6;
      puVar7[1] = 0;
      *(undefined1 *)(puVar7 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_420,(ulong)local_390._M_dataplus._M_p);
      psVar11 = (size_type *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar11) {
        local_440.field_2._M_allocated_capacity = *psVar11;
        local_440.field_2._8_8_ = plVar6[3];
        local_440._M_dataplus._M_p = (pointer)paVar10;
      }
      else {
        local_440.field_2._M_allocated_capacity = *psVar11;
        local_440._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_440._M_string_length = plVar6[1];
      *plVar6 = (long)psVar11;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_440);
      psVar11 = (size_type *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar11) {
        local_460.field_2._M_allocated_capacity = *psVar11;
        local_460.field_2._8_8_ = plVar6[3];
        local_460._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_460.field_2._M_allocated_capacity = *psVar11;
        local_460._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_460._M_string_length = plVar6[1];
      *plVar6 = (long)psVar11;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::_M_append((char *)&local_460,(ulong)local_310);
    }
    else {
      if (3 < dataType - TYPE_UINT) {
        if (local_3dc._0_1_ != '\0') {
          std::__cxx11::string::_M_replace((ulong)&local_150,0,local_148,0x1c00d03);
          std::__cxx11::string::_M_replace((ulong)&local_170,0,local_168,0x1c00d15);
        }
        goto LAB_0119a386;
      }
      std::operator+(&local_400,"(float(a_instanceG",&local_330);
      puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_400);
      local_420 = &local_410;
      plVar6 = puVar7 + 2;
      if ((long *)*puVar7 == plVar6) {
        local_410 = *plVar6;
        lStack_408 = puVar7[3];
      }
      else {
        local_410 = *plVar6;
        local_420 = (long *)*puVar7;
      }
      local_418 = puVar7[1];
      *puVar7 = plVar6;
      puVar7[1] = 0;
      *(undefined1 *)(puVar7 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_420,(ulong)local_3d0._M_dataplus._M_p);
      paVar10 = &local_440.field_2;
      psVar11 = (size_type *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar11) {
        local_440.field_2._M_allocated_capacity = *psVar11;
        local_440.field_2._8_8_ = plVar6[3];
        local_440._M_dataplus._M_p = (pointer)paVar10;
      }
      else {
        local_440.field_2._M_allocated_capacity = *psVar11;
        local_440._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_440._M_string_length = plVar6[1];
      *plVar6 = (long)psVar11;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_440);
      paVar1 = &local_460.field_2;
      psVar11 = (size_type *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar11) {
        local_460.field_2._M_allocated_capacity = *psVar11;
        local_460.field_2._8_8_ = plVar6[3];
        local_460._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_460.field_2._M_allocated_capacity = *psVar11;
        local_460._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_460._M_string_length = plVar6[1];
      *plVar6 = (long)psVar11;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_460,(ulong)local_3b0._M_dataplus._M_p);
      psVar11 = (size_type *)(plVar6 + 2);
      if ((size_type *)*plVar6 == psVar11) {
        local_2e8._16_8_ = *psVar11;
        avStack_2d0[0].
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)plVar6[3];
        local_2e8._0_8_ = pcVar25;
      }
      else {
        local_2e8._16_8_ = *psVar11;
        local_2e8._0_8_ = (size_type *)*plVar6;
      }
      local_2e8._8_8_ = plVar6[1];
      *plVar6 = (long)psVar11;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      std::__cxx11::string::operator=((string *)&local_150,(string *)local_2e8);
      if ((pointer)local_2e8._0_8_ != pcVar25) {
        operator_delete((void *)local_2e8._0_8_,local_2e8._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_460._M_dataplus._M_p != paVar1) {
        operator_delete(local_460._M_dataplus._M_p,local_460.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_440._M_dataplus._M_p != paVar10) {
        operator_delete(local_440._M_dataplus._M_p,local_440.field_2._M_allocated_capacity + 1);
      }
      if (local_420 != &local_410) {
        operator_delete(local_420,local_410 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_400._M_dataplus._M_p != &local_400.field_2) {
        operator_delete(local_400._M_dataplus._M_p,local_400.field_2._M_allocated_capacity + 1);
      }
      std::operator+(&local_400,"(float(a_instanceB",&local_330);
      puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_400);
      plVar6 = puVar7 + 2;
      if ((long *)*puVar7 == plVar6) {
        local_410 = *plVar6;
        lStack_408 = puVar7[3];
        local_420 = &local_410;
      }
      else {
        local_410 = *plVar6;
        local_420 = (long *)*puVar7;
      }
      local_418 = puVar7[1];
      *puVar7 = plVar6;
      puVar7[1] = 0;
      *(undefined1 *)(puVar7 + 2) = 0;
      puVar7 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_420,(ulong)local_3d0._M_dataplus._M_p)
      ;
      psVar11 = puVar7 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar11) {
        local_440.field_2._M_allocated_capacity = *psVar11;
        local_440.field_2._8_8_ = puVar7[3];
        local_440._M_dataplus._M_p = (pointer)paVar10;
      }
      else {
        local_440.field_2._M_allocated_capacity = *psVar11;
        local_440._M_dataplus._M_p = (pointer)*puVar7;
      }
      local_440._M_string_length = puVar7[1];
      *puVar7 = psVar11;
      puVar7[1] = 0;
      *(undefined1 *)(puVar7 + 2) = 0;
      puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_440);
      psVar11 = puVar7 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar11) {
        local_460.field_2._M_allocated_capacity = *psVar11;
        local_460.field_2._8_8_ = puVar7[3];
        local_460._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_460.field_2._M_allocated_capacity = *psVar11;
        local_460._M_dataplus._M_p = (pointer)*puVar7;
      }
      local_460._M_string_length = puVar7[1];
      *puVar7 = psVar11;
      puVar7[1] = 0;
      *(undefined1 *)(puVar7 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_460,(ulong)local_3b0._M_dataplus._M_p);
    }
    psVar11 = (size_type *)(plVar6 + 2);
    if ((size_type *)*plVar6 == psVar11) {
      local_2e8._16_8_ = *psVar11;
      avStack_2d0[0].
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)plVar6[3];
      local_2e8._0_8_ = pcVar25;
    }
    else {
      local_2e8._16_8_ = *psVar11;
      local_2e8._0_8_ = (size_type *)*plVar6;
    }
    local_2e8._8_8_ = plVar6[1];
    *plVar6 = (long)psVar11;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_170,(string *)local_2e8);
    if ((pointer)local_2e8._0_8_ != pcVar25) {
      operator_delete((void *)local_2e8._0_8_,local_2e8._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_460._M_dataplus._M_p != &local_460.field_2) {
      operator_delete(local_460._M_dataplus._M_p,local_460.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_440._M_dataplus._M_p != &local_440.field_2) {
      operator_delete(local_440._M_dataplus._M_p,local_440.field_2._M_allocated_capacity + 1);
    }
    if (local_420 != &local_410) {
      operator_delete(local_420,local_410 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_400._M_dataplus._M_p != &local_400.field_2) goto LAB_0119a37e;
  }
LAB_0119a386:
  std::operator+(&local_460,"in mediump ",&local_70);
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_460);
  psVar11 = (size_type *)(plVar6 + 2);
  if ((size_type *)*plVar6 == psVar11) {
    local_2e8._16_8_ = *psVar11;
    avStack_2d0[0].
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)plVar6[3];
    local_2e8._0_8_ = pcVar25;
  }
  else {
    local_2e8._16_8_ = *psVar11;
    local_2e8._0_8_ = (size_type *)*plVar6;
  }
  local_2e8._8_8_ = plVar6[1];
  *plVar6 = (long)psVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  std::__cxx11::string::_M_append((char *)&local_370,local_2e8._0_8_);
  if ((pointer)local_2e8._0_8_ != pcVar25) {
    operator_delete((void *)local_2e8._0_8_,local_2e8._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_460._M_dataplus._M_p != &local_460.field_2) {
    operator_delete(local_460._M_dataplus._M_p,local_460.field_2._M_allocated_capacity + 1);
  }
  std::operator+(&local_460,"in mediump ",&local_70);
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_460);
  psVar11 = (size_type *)(plVar6 + 2);
  if ((size_type *)*plVar6 == psVar11) {
    local_2e8._16_8_ = *psVar11;
    avStack_2d0[0].
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)plVar6[3];
    local_2e8._0_8_ = pcVar25;
  }
  else {
    local_2e8._16_8_ = *psVar11;
    local_2e8._0_8_ = (size_type *)*plVar6;
  }
  local_2e8._8_8_ = plVar6[1];
  *plVar6 = (long)psVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  std::__cxx11::string::_M_append((char *)&local_370,local_2e8._0_8_);
  if ((pointer)local_2e8._0_8_ != pcVar25) {
    operator_delete((void *)local_2e8._0_8_,local_2e8._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_460._M_dataplus._M_p != &local_460.field_2) {
    operator_delete(local_460._M_dataplus._M_p,local_460.field_2._M_allocated_capacity + 1);
  }
LAB_0119a51e:
  std::operator+(&local_50,"#version 300 es\nin highp vec4 a_position;\n",&local_370);
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_50);
  local_f0 = &local_e0;
  plVar12 = plVar6 + 2;
  if ((long *)*plVar6 == plVar12) {
    local_e0 = *plVar12;
    lStack_d8 = plVar6[3];
  }
  else {
    local_e0 = *plVar12;
    local_f0 = (long *)*plVar6;
  }
  local_e8 = plVar6[1];
  *plVar6 = (long)plVar12;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::_M_append((char *)&local_f0,(ulong)local_110);
  plVar12 = plVar6 + 2;
  if ((long *)*plVar6 == plVar12) {
    local_c0 = *plVar12;
    lStack_b8 = plVar6[3];
    local_d0 = &local_c0;
  }
  else {
    local_c0 = *plVar12;
    local_d0 = (long *)*plVar6;
  }
  local_c8 = plVar6[1];
  *plVar6 = (long)plVar12;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_d0);
  plVar12 = plVar6 + 2;
  if ((long *)*plVar6 == plVar12) {
    local_a0 = *plVar12;
    lStack_98 = plVar6[3];
    local_b0 = &local_a0;
  }
  else {
    local_a0 = *plVar12;
    local_b0 = (long *)*plVar6;
  }
  local_a8 = plVar6[1];
  *plVar6 = (long)plVar12;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_130);
  plVar12 = plVar6 + 2;
  if ((long *)*plVar6 == plVar12) {
    local_80 = *plVar12;
    lStack_78 = plVar6[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *plVar12;
    local_90 = (long *)*plVar6;
  }
  local_88 = plVar6[1];
  *plVar6 = (long)plVar12;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_90);
  local_400._M_dataplus._M_p = (pointer)&local_400.field_2;
  psVar11 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    local_400.field_2._M_allocated_capacity = *psVar11;
    local_400.field_2._8_8_ = plVar6[3];
  }
  else {
    local_400.field_2._M_allocated_capacity = *psVar11;
    local_400._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_400._M_string_length = plVar6[1];
  *plVar6 = (long)psVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::_M_append((char *)&local_400,(ulong)local_150);
  plVar12 = plVar6 + 2;
  if ((long *)*plVar6 == plVar12) {
    local_410 = *plVar12;
    lStack_408 = plVar6[3];
    local_420 = &local_410;
  }
  else {
    local_410 = *plVar12;
    local_420 = (long *)*plVar6;
  }
  local_418 = plVar6[1];
  *plVar6 = (long)plVar12;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_420);
  paVar10 = &local_440.field_2;
  psVar11 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    local_440.field_2._M_allocated_capacity = *psVar11;
    local_440.field_2._8_8_ = plVar6[3];
    local_440._M_dataplus._M_p = (pointer)paVar10;
  }
  else {
    local_440.field_2._M_allocated_capacity = *psVar11;
    local_440._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_440._M_string_length = plVar6[1];
  *plVar6 = (long)psVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::_M_append((char *)&local_440,(ulong)local_170);
  local_2e8._0_8_ = local_2e8 + 0x10;
  psVar11 = (size_type *)(plVar6 + 2);
  if ((size_type *)*plVar6 == psVar11) {
    local_2e8._16_8_ = *psVar11;
    avStack_2d0[0].
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)plVar6[3];
  }
  else {
    local_2e8._16_8_ = *psVar11;
    local_2e8._0_8_ = (size_type *)*plVar6;
  }
  local_2e8._8_8_ = plVar6[1];
  *plVar6 = (long)psVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append(local_2e8);
  local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
  psVar11 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    local_460.field_2._M_allocated_capacity = *psVar11;
    local_460.field_2._8_8_ = plVar6[3];
  }
  else {
    local_460.field_2._M_allocated_capacity = *psVar11;
    local_460._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_460._M_string_length = plVar6[1];
  *plVar6 = (long)psVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  if ((undefined1 *)local_2e8._0_8_ != local_2e8 + 0x10) {
    operator_delete((void *)local_2e8._0_8_,local_2e8._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_440._M_dataplus._M_p != paVar10) {
    operator_delete(local_440._M_dataplus._M_p,local_440.field_2._M_allocated_capacity + 1);
  }
  if (local_420 != &local_410) {
    operator_delete(local_420,local_410 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_400._M_dataplus._M_p != &local_400.field_2) {
    operator_delete(local_400._M_dataplus._M_p,local_400.field_2._M_allocated_capacity + 1);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,local_a0 + 1);
  }
  if (local_d0 != &local_c0) {
    operator_delete(local_d0,local_c0 + 1);
  }
  if (local_f0 != &local_e0) {
    operator_delete(local_f0,local_e0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  this_02 = (ShaderProgram *)operator_new(0xd0);
  renderCtx = ((this->super_TestCase).m_context)->m_renderCtx;
  local_440._M_dataplus._M_p = (pointer)paVar10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_440,
             "#version 300 es\nlayout(location = 0) out mediump vec4 o_color;\nin mediump vec4 v_color;\n\nvoid main()\n{\n\to_color = v_color;\n}\n"
             ,"");
  memset((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_2e8,0,0xac);
  local_238._0_8_ = (pointer)0x0;
  local_238[8] = 0;
  local_238._9_7_ = 0;
  local_238[0x10] = 0;
  local_238._17_8_ = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_2e8,&local_460);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(avStack_2d0,&local_440);
  glu::ShaderProgram::ShaderProgram(this_02,renderCtx,(ProgramSources *)local_2e8);
  this->m_program = this_02;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_238);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_258);
  lVar29 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_2e8 + lVar29));
    lVar29 = lVar29 + -0x18;
  } while (lVar29 != -0x18);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_440._M_dataplus._M_p != paVar10) {
    operator_delete(local_440._M_dataplus._M_p,local_440.field_2._M_allocated_capacity + 1);
  }
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                  this->m_program);
  if ((this->m_program->m_program).m_info.linkOk == false) {
    this_03 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_03,"Failed to compile shader",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fInstancedRenderingTests.cpp"
               ,0x136);
    __cxa_throw(this_03,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  this_00 = &this->m_gridVertexPositions;
  if (this->m_function == FUNCTION_DRAW_ELEMENTS_INSTANCED) {
    iVar4 = 0;
    do {
      iVar27 = 0;
      do {
        fVar32 = ((float)iVar27 / 127.0 + (float)iVar27 / 127.0) / (float)this->m_numInstances +
                 -1.0;
        local_2e8._0_4_ = fVar32;
        local_440._M_dataplus._M_p._0_4_ = (float)iVar4 / 127.0 + (float)iVar4 / 127.0 + -1.0;
        iVar20._M_current =
             (this->m_gridVertexPositions).super__Vector_base<float,_std::allocator<float>_>._M_impl
             .super__Vector_impl_data._M_finish;
        pfVar9 = (this->m_gridVertexPositions).super__Vector_base<float,_std::allocator<float>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
        if (iVar20._M_current == pfVar9) {
          std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                    ((vector<float,std::allocator<float>> *)this_00,iVar20,(float *)local_2e8);
          iVar20._M_current =
               (this->m_gridVertexPositions).super__Vector_base<float,_std::allocator<float>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          pfVar9 = (this->m_gridVertexPositions).super__Vector_base<float,_std::allocator<float>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
        }
        else {
          *iVar20._M_current = fVar32;
          iVar20._M_current = iVar20._M_current + 1;
          (this->m_gridVertexPositions).super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar20._M_current;
        }
        if (iVar20._M_current == pfVar9) {
          std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                    ((vector<float,std::allocator<float>> *)this_00,iVar20,(float *)&local_440);
        }
        else {
          *iVar20._M_current = local_440._M_dataplus._M_p._0_4_;
          (this->m_gridVertexPositions).super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar20._M_current + 1;
        }
        iVar27 = iVar27 + 1;
      } while (iVar27 != 0x80);
      iVar4 = iVar4 + 1;
    } while (iVar4 != 0x80);
    this_01 = &this->m_gridIndices;
    uVar3 = 0;
    fVar32 = 0.0;
    do {
      iVar4 = 0x7f;
      local_3dc = fVar32;
      uVar15 = uVar3;
      do {
        iVar19._M_current =
             (this->m_gridIndices).
             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_finish;
        puVar8 = (this->m_gridIndices).
                 super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
        if (iVar19._M_current == puVar8) {
          local_2e8._0_2_ = uVar15;
          std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
          _M_realloc_insert<unsigned_short>(this_01,iVar19,(unsigned_short *)local_2e8);
          iVar19._M_current =
               (this->m_gridIndices).
               super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
               super__Vector_impl_data._M_finish;
          puVar8 = (this->m_gridIndices).
                   super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
        }
        else {
          *iVar19._M_current = uVar15;
          iVar19._M_current = iVar19._M_current + 1;
          (this->m_gridIndices).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
          _M_impl.super__Vector_impl_data._M_finish = iVar19._M_current;
        }
        uVar22 = uVar15 + 1;
        if (iVar19._M_current == puVar8) {
          local_2e8._0_2_ = uVar22;
          std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
          _M_realloc_insert<unsigned_short>(this_01,iVar19,(unsigned_short *)local_2e8);
          iVar19._M_current =
               (this->m_gridIndices).
               super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
               super__Vector_impl_data._M_finish;
          puVar8 = (this->m_gridIndices).
                   super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
        }
        else {
          *iVar19._M_current = uVar22;
          iVar19._M_current = iVar19._M_current + 1;
          (this->m_gridIndices).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
          _M_impl.super__Vector_impl_data._M_finish = iVar19._M_current;
        }
        uVar30 = uVar15 + 0x80;
        if (iVar19._M_current == puVar8) {
          local_2e8._0_2_ = uVar30;
          std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
          _M_realloc_insert<unsigned_short>(this_01,iVar19,(unsigned_short *)local_2e8);
          iVar19._M_current =
               (this->m_gridIndices).
               super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
               super__Vector_impl_data._M_finish;
          puVar8 = (this->m_gridIndices).
                   super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
        }
        else {
          *iVar19._M_current = uVar30;
          iVar19._M_current = iVar19._M_current + 1;
          (this->m_gridIndices).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
          _M_impl.super__Vector_impl_data._M_finish = iVar19._M_current;
        }
        local_2e8._0_2_ = uVar15 + 0x81;
        if (iVar19._M_current == puVar8) {
          std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
          _M_realloc_insert<unsigned_short>(this_01,iVar19,(unsigned_short *)local_2e8);
          iVar19._M_current =
               (this->m_gridIndices).
               super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
               super__Vector_impl_data._M_finish;
          puVar8 = (this->m_gridIndices).
                   super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
        }
        else {
          *iVar19._M_current = local_2e8._0_2_;
          iVar19._M_current = iVar19._M_current + 1;
          (this->m_gridIndices).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
          _M_impl.super__Vector_impl_data._M_finish = iVar19._M_current;
        }
        if (iVar19._M_current == puVar8) {
          local_2e8._0_2_ = uVar30;
          std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
          _M_realloc_insert<unsigned_short>(this_01,iVar19,(unsigned_short *)local_2e8);
          iVar19._M_current =
               (this->m_gridIndices).
               super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
               super__Vector_impl_data._M_finish;
          puVar8 = (this->m_gridIndices).
                   super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
        }
        else {
          *iVar19._M_current = uVar30;
          iVar19._M_current = iVar19._M_current + 1;
          (this->m_gridIndices).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
          _M_impl.super__Vector_impl_data._M_finish = iVar19._M_current;
        }
        local_2e8._0_2_ = uVar22;
        if (iVar19._M_current == puVar8) {
          std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
          _M_realloc_insert<unsigned_short>(this_01,iVar19,(unsigned_short *)local_2e8);
        }
        else {
          *iVar19._M_current = uVar22;
          (this->m_gridIndices).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
          _M_impl.super__Vector_impl_data._M_finish = iVar19._M_current + 1;
        }
        uVar15 = uVar15 + 1;
        iVar4 = iVar4 + -1;
      } while (iVar4 != 0);
      fVar32 = (float)((int)local_3dc + 1);
      uVar3 = uVar3 + 0x80;
    } while (fVar32 != 1.77965e-43);
  }
  else {
    local_2ec = 0;
    do {
      fVar32 = (float)local_2ec;
      local_2ec = local_2ec + 1;
      local_3dc = (float)local_2ec / 127.0 + (float)local_2ec / 127.0 + -1.0;
      iVar4 = 1;
      do {
        fVar33 = (float)(iVar4 + -1) / 127.0;
        fVar33 = (fVar33 + fVar33) / (float)this->m_numInstances + -1.0;
        local_2e8._0_4_ = fVar33;
        local_440._M_dataplus._M_p._0_4_ =
             ((float)iVar4 / 127.0 + (float)iVar4 / 127.0) / (float)this->m_numInstances + -1.0;
        local_420 = (long *)CONCAT44(local_420._4_4_,fVar32 / 127.0 + fVar32 / 127.0 + -1.0);
        local_400._M_dataplus._M_p._0_4_ = local_3dc;
        iVar20._M_current =
             (this->m_gridVertexPositions).super__Vector_base<float,_std::allocator<float>_>._M_impl
             .super__Vector_impl_data._M_finish;
        pfVar9 = (this->m_gridVertexPositions).super__Vector_base<float,_std::allocator<float>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
        if (iVar20._M_current == pfVar9) {
          std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                    ((vector<float,std::allocator<float>> *)this_00,iVar20,(float *)local_2e8);
          iVar20._M_current =
               (this->m_gridVertexPositions).super__Vector_base<float,_std::allocator<float>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          pfVar9 = (this->m_gridVertexPositions).super__Vector_base<float,_std::allocator<float>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
        }
        else {
          *iVar20._M_current = fVar33;
          iVar20._M_current = iVar20._M_current + 1;
          (this->m_gridVertexPositions).super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar20._M_current;
        }
        if (iVar20._M_current == pfVar9) {
          std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                    ((vector<float,std::allocator<float>> *)this_00,iVar20,(float *)&local_420);
          iVar20._M_current =
               (this->m_gridVertexPositions).super__Vector_base<float,_std::allocator<float>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          pfVar9 = (this->m_gridVertexPositions).super__Vector_base<float,_std::allocator<float>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
        }
        else {
          *iVar20._M_current = local_420._0_4_;
          iVar20._M_current = iVar20._M_current + 1;
          (this->m_gridVertexPositions).super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar20._M_current;
        }
        if (iVar20._M_current == pfVar9) {
          std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                    ((vector<float,std::allocator<float>> *)this_00,iVar20,(float *)&local_440);
          iVar20._M_current =
               (this->m_gridVertexPositions).super__Vector_base<float,_std::allocator<float>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          pfVar9 = (this->m_gridVertexPositions).super__Vector_base<float,_std::allocator<float>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
        }
        else {
          *iVar20._M_current = local_440._M_dataplus._M_p._0_4_;
          iVar20._M_current = iVar20._M_current + 1;
          (this->m_gridVertexPositions).super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar20._M_current;
        }
        if (iVar20._M_current == pfVar9) {
          std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                    ((vector<float,std::allocator<float>> *)this_00,iVar20,(float *)&local_420);
          iVar20._M_current =
               (this->m_gridVertexPositions).super__Vector_base<float,_std::allocator<float>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          pfVar9 = (this->m_gridVertexPositions).super__Vector_base<float,_std::allocator<float>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
        }
        else {
          *iVar20._M_current = local_420._0_4_;
          iVar20._M_current = iVar20._M_current + 1;
          (this->m_gridVertexPositions).super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar20._M_current;
        }
        if (iVar20._M_current == pfVar9) {
          std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                    ((vector<float,std::allocator<float>> *)this_00,iVar20,(float *)local_2e8);
          iVar20._M_current =
               (this->m_gridVertexPositions).super__Vector_base<float,_std::allocator<float>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          pfVar9 = (this->m_gridVertexPositions).super__Vector_base<float,_std::allocator<float>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
        }
        else {
          *iVar20._M_current = (float)local_2e8._0_4_;
          iVar20._M_current = iVar20._M_current + 1;
          (this->m_gridVertexPositions).super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar20._M_current;
        }
        if (iVar20._M_current == pfVar9) {
          std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                    ((vector<float,std::allocator<float>> *)this_00,iVar20,(float *)&local_400);
          iVar20._M_current =
               (this->m_gridVertexPositions).super__Vector_base<float,_std::allocator<float>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          pfVar9 = (this->m_gridVertexPositions).super__Vector_base<float,_std::allocator<float>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
        }
        else {
          *iVar20._M_current = local_400._M_dataplus._M_p._0_4_;
          iVar20._M_current = iVar20._M_current + 1;
          (this->m_gridVertexPositions).super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar20._M_current;
        }
        if (iVar20._M_current == pfVar9) {
          std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                    ((vector<float,std::allocator<float>> *)this_00,iVar20,(float *)&local_440);
          iVar20._M_current =
               (this->m_gridVertexPositions).super__Vector_base<float,_std::allocator<float>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          pfVar9 = (this->m_gridVertexPositions).super__Vector_base<float,_std::allocator<float>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
        }
        else {
          *iVar20._M_current = local_440._M_dataplus._M_p._0_4_;
          iVar20._M_current = iVar20._M_current + 1;
          (this->m_gridVertexPositions).super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar20._M_current;
        }
        if (iVar20._M_current == pfVar9) {
          std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                    ((vector<float,std::allocator<float>> *)this_00,iVar20,(float *)&local_400);
          iVar20._M_current =
               (this->m_gridVertexPositions).super__Vector_base<float,_std::allocator<float>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          pfVar9 = (this->m_gridVertexPositions).super__Vector_base<float,_std::allocator<float>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
        }
        else {
          *iVar20._M_current = local_400._M_dataplus._M_p._0_4_;
          iVar20._M_current = iVar20._M_current + 1;
          (this->m_gridVertexPositions).super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar20._M_current;
        }
        if (iVar20._M_current == pfVar9) {
          std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                    ((vector<float,std::allocator<float>> *)this_00,iVar20,(float *)local_2e8);
          iVar20._M_current =
               (this->m_gridVertexPositions).super__Vector_base<float,_std::allocator<float>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          pfVar9 = (this->m_gridVertexPositions).super__Vector_base<float,_std::allocator<float>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
        }
        else {
          *iVar20._M_current = (float)local_2e8._0_4_;
          iVar20._M_current = iVar20._M_current + 1;
          (this->m_gridVertexPositions).super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar20._M_current;
        }
        if (iVar20._M_current == pfVar9) {
          std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                    ((vector<float,std::allocator<float>> *)this_00,iVar20,(float *)&local_400);
          iVar20._M_current =
               (this->m_gridVertexPositions).super__Vector_base<float,_std::allocator<float>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          pfVar9 = (this->m_gridVertexPositions).super__Vector_base<float,_std::allocator<float>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
        }
        else {
          *iVar20._M_current = local_400._M_dataplus._M_p._0_4_;
          iVar20._M_current = iVar20._M_current + 1;
          (this->m_gridVertexPositions).super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar20._M_current;
        }
        if (iVar20._M_current == pfVar9) {
          std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                    ((vector<float,std::allocator<float>> *)this_00,iVar20,(float *)&local_440);
          iVar20._M_current =
               (this->m_gridVertexPositions).super__Vector_base<float,_std::allocator<float>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          pfVar9 = (this->m_gridVertexPositions).super__Vector_base<float,_std::allocator<float>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
        }
        else {
          *iVar20._M_current = local_440._M_dataplus._M_p._0_4_;
          iVar20._M_current = iVar20._M_current + 1;
          (this->m_gridVertexPositions).super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar20._M_current;
        }
        if (iVar20._M_current == pfVar9) {
          std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                    ((vector<float,std::allocator<float>> *)this_00,iVar20,(float *)&local_420);
        }
        else {
          *iVar20._M_current = local_420._0_4_;
          (this->m_gridVertexPositions).super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar20._M_current + 1;
        }
        iVar4 = iVar4 + 1;
      } while (iVar4 != 0x80);
    } while (local_2ec != 0x7f);
  }
  if (this->m_instancingType - TYPE_ATTRIB_DIVISOR < 2) {
    uVar16 = this->m_numInstances;
    if (this->m_instancingType == TYPE_ATTRIB_DIVISOR) {
      if (0 < (int)uVar16) {
        iVar4 = 0;
        do {
          fVar32 = ((float)iVar4 + (float)iVar4) / (float)(int)uVar16;
          local_2e8._0_4_ = fVar32;
          iVar20._M_current =
               (this->m_instanceOffsets).super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar20._M_current ==
              (this->m_instanceOffsets).super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                      (&this->m_instanceOffsets,iVar20,(float *)local_2e8);
          }
          else {
            *iVar20._M_current = fVar32;
            (this->m_instanceOffsets).super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar20._M_current + 1;
          }
          bVar2 = true;
          do {
            bVar14 = bVar2;
            local_2e8._0_8_ = local_2e8._0_8_ & 0xffffffff00000000;
            iVar20._M_current =
                 (this->m_instanceOffsets).super__Vector_base<float,_std::allocator<float>_>._M_impl
                 .super__Vector_impl_data._M_finish;
            if (iVar20._M_current ==
                (this->m_instanceOffsets).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                        (&this->m_instanceOffsets,iVar20,(float *)local_2e8);
            }
            else {
              *iVar20._M_current = 0.0;
              (this->m_instanceOffsets).super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish = iVar20._M_current + 1;
            }
            bVar2 = false;
          } while (bVar14);
          iVar4 = iVar4 + 1;
          uVar16 = this->m_numInstances;
        } while (iVar4 < (int)uVar16);
      }
      uVar31 = (uint)(0x55555554 < uVar16 * -0x55555555 + 0x2aaaaaaa);
      iVar4 = uVar31 + (int)uVar16 / 3;
      if (iVar4 != 0 && SCARRY4(uVar31,(int)uVar16 / 3) == iVar4 < 0) {
        iVar27 = (int)local_3d8 + -1;
        iVar23 = 0;
        do {
          pushVarCompAttrib(this,&this->m_instanceColorR,(float)iVar23 / (float)iVar4);
          iVar28 = iVar27;
          if (0 < iVar27) {
            do {
              pushVarCompAttrib(this,&this->m_instanceColorR,0.0);
              iVar28 = iVar28 + -1;
            } while (iVar28 != 0);
          }
          iVar23 = iVar23 + 1;
        } while (iVar23 != iVar4);
        uVar16 = this->m_numInstances;
      }
    }
    iVar4 = (uVar16 & 1) + (int)uVar16 / 2;
    if (0 < iVar4) {
      iVar27 = (int)local_3d8 + -1;
      iVar23 = 0;
      do {
        pushVarCompAttrib(this,&this->m_instanceColorG,
                          ((float)iVar23 + (float)iVar23) / (float)iVar4);
        iVar28 = iVar27;
        if (0 < iVar27) {
          do {
            pushVarCompAttrib(this,&this->m_instanceColorG,0.0);
            iVar28 = iVar28 + -1;
          } while (iVar28 != 0);
        }
        iVar23 = iVar23 + 1;
      } while (iVar23 != iVar4);
      uVar16 = this->m_numInstances;
    }
    if (0 < (int)uVar16) {
      local_3d8 = (ulong)((int)local_3d8 - 1);
      uVar31 = 0;
      do {
        pushVarCompAttrib(this,&this->m_instanceColorB,1.0 - (float)(int)uVar31 / (float)(int)uVar16
                         );
        uVar26 = local_3d8 & 0xffffffff;
        if (0 < (int)local_3d8) {
          do {
            pushVarCompAttrib(this,&this->m_instanceColorB,0.0);
            uVar24 = (int)uVar26 - 1;
            uVar26 = (ulong)uVar24;
          } while (uVar24 != 0);
        }
        uVar31 = uVar31 + 1;
      } while (uVar31 != uVar16);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_460._M_dataplus._M_p != &local_460.field_2) {
    operator_delete(local_460._M_dataplus._M_p,local_460.field_2._M_allocated_capacity + 1);
  }
  if (local_170 != &local_160) {
    operator_delete(local_170,CONCAT71(uStack_15f,local_160) + 1);
  }
  if (local_150 != &local_140) {
    operator_delete(local_150,CONCAT71(uStack_13f,local_140) + 1);
  }
  if (local_130 != &local_120) {
    operator_delete(local_130,CONCAT71(uStack_11f,local_120) + 1);
  }
  if (local_110 != &local_100) {
    operator_delete(local_110,CONCAT71(uStack_ff,local_100) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_370._M_dataplus._M_p != &local_370.field_2) {
    operator_delete(local_370._M_dataplus._M_p,
                    CONCAT71(local_370.field_2._M_allocated_capacity._1_7_,
                             local_370.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_350._M_dataplus._M_p != &local_350.field_2) {
    operator_delete(local_350._M_dataplus._M_p,local_350.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
    operator_delete(local_3d0._M_dataplus._M_p,local_3d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
    operator_delete(local_3b0._M_dataplus._M_p,local_3b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390._M_dataplus._M_p != &local_390.field_2) {
    operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
  }
  if (local_310 != &local_300) {
    operator_delete(local_310,local_300 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  paVar10 = &local_330.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_330._M_dataplus._M_p != paVar10) {
    operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
    paVar10 = extraout_RAX;
  }
  return (int)paVar10;
}

Assistant:

void InstancedRenderingCase::init (void)
{
	bool	isFloatCase			= glu::isDataTypeFloatOrVec(m_rgbAttrType);
	bool	isIntCase			= glu::isDataTypeIntOrIVec(m_rgbAttrType);
	bool	isUintCase			= glu::isDataTypeUintOrUVec(m_rgbAttrType);
	bool	isMatCase			= glu::isDataTypeMatrix(m_rgbAttrType);
	int		typeSize			= glu::getDataTypeScalarSize(m_rgbAttrType);
	bool	isScalarCase		= typeSize == 1;
	string	swizzleFirst		= isScalarCase ? "" : ".x";
	string	typeName			= glu::getDataTypeName(m_rgbAttrType);

	string	floatIntScaleStr	= "(" + de::floatToString(FLOAT_INT_SCALE, 3) + ")";
	string	floatIntBiasStr		= "(" + de::floatToString(FLOAT_INT_BIAS, 3) + ")";
	string	floatUintScaleStr	= "(" + de::floatToString(FLOAT_UINT_SCALE, 3) + ")";
	string	floatUintBiasStr	= "(" + de::floatToString(FLOAT_UINT_BIAS, 3) + ")";

	DE_ASSERT(isFloatCase || isIntCase || isUintCase || isMatCase);

	// Generate shader.
	// \note For case TYPE_MIXED, vertex position offset and color red component get their values from instance id, while green and blue get their values from instanced attributes.

	string numInstancesStr = de::toString(m_numInstances) + ".0";

	string instanceAttribs;
	string posExpression;
	string colorRExpression;
	string colorGExpression;
	string colorBExpression;

	if (m_instancingType == TYPE_INSTANCE_ID || m_instancingType == TYPE_MIXED)
	{
		posExpression = "a_position + vec4(float(gl_InstanceID) * 2.0 / " + numInstancesStr + ", 0.0, 0.0, 0.0)";
		colorRExpression = "float(gl_InstanceID)/" + numInstancesStr;

		if (m_instancingType == TYPE_INSTANCE_ID)
		{
			colorGExpression = "float(gl_InstanceID)*2.0/" + numInstancesStr;
			colorBExpression = "1.0 - float(gl_InstanceID)/" + numInstancesStr;
		}
	}

	if (m_instancingType == TYPE_ATTRIB_DIVISOR || m_instancingType == TYPE_MIXED)
	{
		if (m_instancingType == TYPE_ATTRIB_DIVISOR)
		{
			posExpression = "a_position + vec4(a_instanceOffset";

			DE_STATIC_ASSERT(OFFSET_COMPONENTS >= 1 && OFFSET_COMPONENTS <= 4);

			for (int i = 0; i < 4-OFFSET_COMPONENTS; i++)
				posExpression += ", 0.0";
			posExpression += ")";

			if (isFloatCase)
				colorRExpression = "a_instanceR" + swizzleFirst;
			else if (isIntCase)
				colorRExpression = "(float(a_instanceR" + swizzleFirst + ") - " + floatIntBiasStr + ") / " + floatIntScaleStr;
			else if (isUintCase)
				colorRExpression = "(float(a_instanceR" + swizzleFirst + ") - " + floatUintBiasStr + ") / " + floatUintScaleStr;
			else if (isMatCase)
				colorRExpression = "a_instanceR[0][0]";
			else
				DE_ASSERT(DE_FALSE);

			instanceAttribs += "in highp " + (OFFSET_COMPONENTS == 1 ? string("float") : "vec" + de::toString(OFFSET_COMPONENTS)) + " a_instanceOffset;\n";
			instanceAttribs += "in mediump " + typeName + " a_instanceR;\n";
		}

		if (isFloatCase)
		{
			colorGExpression = "a_instanceG" + swizzleFirst;
			colorBExpression = "a_instanceB" + swizzleFirst;
		}
		else if (isIntCase)
		{
			colorGExpression = "(float(a_instanceG" + swizzleFirst + ") - " + floatIntBiasStr + ") / " + floatIntScaleStr;
			colorBExpression = "(float(a_instanceB" + swizzleFirst + ") - " + floatIntBiasStr + ") / " + floatIntScaleStr;
		}
		else if (isUintCase)
		{
			colorGExpression = "(float(a_instanceG" + swizzleFirst + ") - " + floatUintBiasStr + ") / " + floatUintScaleStr;
			colorBExpression = "(float(a_instanceB" + swizzleFirst + ") - " + floatUintBiasStr + ") / " + floatUintScaleStr;
		}
		else if (isMatCase)
		{
			colorGExpression = "a_instanceG[0][0]";
			colorBExpression = "a_instanceB[0][0]";
		}
		else
			DE_ASSERT(DE_FALSE);

		instanceAttribs += "in mediump " + typeName + " a_instanceG;\n";
		instanceAttribs += "in mediump " + typeName + " a_instanceB;\n";
	}

	DE_ASSERT(!posExpression.empty());
	DE_ASSERT(!colorRExpression.empty());
	DE_ASSERT(!colorGExpression.empty());
	DE_ASSERT(!colorBExpression.empty());

	std::string vertShaderSourceStr =
		"#version 300 es\n"
		"in highp vec4 a_position;\n" +
		instanceAttribs +
		"out mediump vec4 v_color;\n"
		"\n"
		"void main()\n"
		"{\n"
		"	gl_Position = " + posExpression + ";\n"
		"	v_color.r = " + colorRExpression + ";\n"
		"	v_color.g = " + colorGExpression + ";\n"
		"	v_color.b = " + colorBExpression + ";\n"
		"	v_color.a = 1.0;\n"
		"}\n";

	static const char* fragShaderSource =
		"#version 300 es\n"
		"layout(location = 0) out mediump vec4 o_color;\n"
		"in mediump vec4 v_color;\n"
		"\n"
		"void main()\n"
		"{\n"
		"	o_color = v_color;\n"
		"}\n";

	// Create shader program and log it.

	DE_ASSERT(!m_program);
	m_program = new glu::ShaderProgram(m_context.getRenderContext(), glu::makeVtxFragSources(vertShaderSourceStr, fragShaderSource));

	tcu::TestLog& log = m_testCtx.getLog();

	log << *m_program;

	if(!m_program->isOk())
		TCU_FAIL("Failed to compile shader");

	// Vertex shader attributes.

	if (m_function == FUNCTION_DRAW_ELEMENTS_INSTANCED)
	{
		// Vertex positions. Positions form a vertical bar of width <screen width>/<number of instances>.

		for (int y = 0; y < QUAD_GRID_SIZE + 1; y++)
			for (int x = 0; x < QUAD_GRID_SIZE + 1; x++)
			{
				float fx = -1.0f + (float)x / (float)QUAD_GRID_SIZE * 2.0f / (float)m_numInstances;
				float fy = -1.0f + (float)y / (float)QUAD_GRID_SIZE * 2.0f;

				m_gridVertexPositions.push_back(fx);
				m_gridVertexPositions.push_back(fy);
			}

		// Indices.

		for (int y = 0; y < QUAD_GRID_SIZE; y++)
			for (int x = 0; x < QUAD_GRID_SIZE; x++)
			{
				int ndx00 = y*(QUAD_GRID_SIZE + 1) + x;
				int ndx10 = y*(QUAD_GRID_SIZE + 1) + x + 1;
				int ndx01 = (y + 1)*(QUAD_GRID_SIZE + 1) + x;
				int ndx11 = (y + 1)*(QUAD_GRID_SIZE + 1) + x + 1;

				// Lower-left triangle of a quad.
				m_gridIndices.push_back((deUint16)ndx00);
				m_gridIndices.push_back((deUint16)ndx10);
				m_gridIndices.push_back((deUint16)ndx01);

				// Upper-right triangle of a quad.
				m_gridIndices.push_back((deUint16)ndx11);
				m_gridIndices.push_back((deUint16)ndx01);
				m_gridIndices.push_back((deUint16)ndx10);
			}
	}
	else
	{
		DE_ASSERT(m_function == FUNCTION_DRAW_ARRAYS_INSTANCED);

		// Vertex positions. Positions form a vertical bar of width <screen width>/<number of instances>.

		for (int y = 0; y < QUAD_GRID_SIZE; y++)
			for (int x = 0; x < QUAD_GRID_SIZE; x++)
			{
				float fx0 = -1.0f + (float)(x+0) / (float)QUAD_GRID_SIZE * 2.0f / (float)m_numInstances;
				float fx1 = -1.0f + (float)(x+1) / (float)QUAD_GRID_SIZE * 2.0f / (float)m_numInstances;
				float fy0 = -1.0f + (float)(y+0) / (float)QUAD_GRID_SIZE * 2.0f;
				float fy1 = -1.0f + (float)(y+1) / (float)QUAD_GRID_SIZE * 2.0f;

				// Vertices of a quad's lower-left triangle: (fx0, fy0), (fx1, fy0) and (fx0, fy1)
				m_gridVertexPositions.push_back(fx0);
				m_gridVertexPositions.push_back(fy0);
				m_gridVertexPositions.push_back(fx1);
				m_gridVertexPositions.push_back(fy0);
				m_gridVertexPositions.push_back(fx0);
				m_gridVertexPositions.push_back(fy1);

				// Vertices of a quad's upper-right triangle: (fx1, fy1), (fx0, fy1) and (fx1, fy0)
				m_gridVertexPositions.push_back(fx1);
				m_gridVertexPositions.push_back(fy1);
				m_gridVertexPositions.push_back(fx0);
				m_gridVertexPositions.push_back(fy1);
				m_gridVertexPositions.push_back(fx1);
				m_gridVertexPositions.push_back(fy0);
			}
	}

	// Instanced attributes: position offset and color RGB components.

	if (m_instancingType == TYPE_ATTRIB_DIVISOR || m_instancingType == TYPE_MIXED)
	{
		if (m_instancingType == TYPE_ATTRIB_DIVISOR)
		{
			// Offsets are such that the vertical bars are drawn next to each other.
			for (int i = 0; i < m_numInstances; i++)
			{
				m_instanceOffsets.push_back((float)i * 2.0f / (float)m_numInstances);

				DE_STATIC_ASSERT(OFFSET_COMPONENTS >= 1 && OFFSET_COMPONENTS <= 4);

				for (int j = 0; j < OFFSET_COMPONENTS-1; j++)
					m_instanceOffsets.push_back(0.0f);
			}

			int rInstances = m_numInstances / ATTRIB_DIVISOR_R + (m_numInstances % ATTRIB_DIVISOR_R == 0 ? 0 : 1);
			for (int i = 0; i < rInstances; i++)
			{
				pushVarCompAttrib(m_instanceColorR, (float)i / (float)rInstances);

				for (int j = 0; j < typeSize - 1; j++)
					pushVarCompAttrib(m_instanceColorR, 0.0f);
			}
		}

		int gInstances = m_numInstances / ATTRIB_DIVISOR_G + (m_numInstances % ATTRIB_DIVISOR_G == 0 ? 0 : 1);
		for (int i = 0; i < gInstances; i++)
		{
			pushVarCompAttrib(m_instanceColorG, (float)i*2.0f / (float)gInstances);

			for (int j = 0; j < typeSize - 1; j++)
				pushVarCompAttrib(m_instanceColorG, 0.0f);
		}

		int bInstances = m_numInstances / ATTRIB_DIVISOR_B + (m_numInstances % ATTRIB_DIVISOR_B == 0 ? 0 : 1);
		for (int i = 0; i < bInstances; i++)
		{
			pushVarCompAttrib(m_instanceColorB, 1.0f - (float)i / (float)bInstances);

			for (int j = 0; j < typeSize - 1; j++)
				pushVarCompAttrib(m_instanceColorB, 0.0f);
		}
	}
}